

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::reduceTri
               (void *src,int sstride,int w,int param_4,void *dst,int dstride,DataType dt,int nchan)

{
  byte *pbVar1;
  ushort *puVar2;
  ushort *puVar3;
  float *pfVar4;
  float *pfVar5;
  uint16_t uVar6;
  int iVar7;
  byte *pbVar8;
  float *pfVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  byte *pbVar15;
  ushort *puVar16;
  
  switch(dt) {
  case dt_uint8:
    iVar14 = w * sstride;
    if (iVar14 != 0) {
      iVar10 = nchan * w;
      lVar13 = (long)nchan;
      pbVar15 = (byte *)((long)iVar14 + (long)src);
      pbVar8 = (byte *)((long)src + (((long)iVar10 + (long)((w + -1) * sstride)) - lVar13));
      do {
        if (iVar10 != 0) {
          pbVar1 = (byte *)((long)src + (long)iVar10);
          do {
            lVar11 = lVar13;
            if (nchan != 0) {
              do {
                *(char *)dst = (char)((uint)*pbVar8 + (uint)*(byte *)((long)src + (long)sstride) +
                                      (uint)*(byte *)((long)src + lVar13) + (uint)*src >> 2);
                dst = (void *)((long)dst + 1);
                src = (void *)((long)src + 1);
                pbVar8 = pbVar8 + 1;
                lVar11 = lVar11 + -1;
              } while (lVar11 != 0);
            }
            pbVar8 = pbVar8 + -(nchan + sstride * 2);
            src = (void *)((long)src + lVar13);
          } while ((byte *)src != pbVar1);
        }
        dst = (void *)((long)dst + (long)(dstride - iVar10 / 2));
        pbVar8 = pbVar8 + (iVar14 + nchan * -2);
        src = (void *)((long)src + (long)(sstride * 2 - iVar10));
      } while ((byte *)src != pbVar15);
    }
    break;
  case dt_uint16:
    iVar10 = sstride / 2;
    iVar14 = iVar10 * w;
    if (iVar14 != 0) {
      iVar12 = nchan * w;
      lVar13 = (long)nchan;
      puVar2 = (ushort *)((long)src + (long)iVar14 * 2);
      puVar16 = (ushort *)
                ((long)src + lVar13 * -2 + (long)iVar12 * 2 + (long)((w + -1) * iVar10) * 2);
      do {
        if (iVar12 != 0) {
          puVar3 = (ushort *)((long)src + (long)iVar12 * 2);
          do {
            lVar11 = lVar13 * 2;
            if (nchan != 0) {
              do {
                *(short *)dst =
                     (short)((uint)*puVar16 + (uint)*(ushort *)((long)src + (long)iVar10 * 2) +
                             (uint)*(ushort *)((long)src + lVar13 * 2) + (uint)*src >> 2);
                dst = (void *)((long)dst + 2);
                src = (void *)((long)src + 2);
                puVar16 = puVar16 + 1;
                lVar11 = lVar11 + -2;
              } while (lVar11 != 0);
            }
            src = (void *)((long)src + lVar13 * 2);
            puVar16 = puVar16 + -(nchan + iVar10 * 2);
          } while ((ushort *)src != puVar3);
        }
        src = (void *)((long)src + (long)(iVar10 * 2 - iVar12) * 2);
        puVar16 = puVar16 + (iVar14 + nchan * -2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar12 / 2) * 2);
      } while ((ushort *)src != puVar2);
    }
    break;
  case dt_half:
    iVar14 = sstride / 2;
    iVar10 = iVar14 * w;
    if (iVar10 != 0) {
      iVar12 = nchan * w;
      lVar13 = (long)nchan;
      puVar2 = (ushort *)((long)src + (long)iVar10 * 2);
      puVar16 = (ushort *)
                ((long)src + lVar13 * -2 + (long)iVar12 * 2 + (long)((w + -1) * iVar14) * 2);
      do {
        if (iVar12 != 0) {
          puVar3 = (ushort *)((long)src + (long)iVar12 * 2);
          do {
            lVar11 = lVar13 * 2;
            if (nchan != 0) {
              do {
                uVar6 = PtexHalf::fromFloat((*(float *)(PtexHalf::h2fTable + (ulong)*src * 4) +
                                             *(float *)(PtexHalf::h2fTable +
                                                       (ulong)*(ushort *)((long)src + lVar13 * 2) *
                                                       4) +
                                             *(float *)(PtexHalf::h2fTable +
                                                       (ulong)*(ushort *)
                                                               ((long)src + (long)iVar14 * 2) * 4) +
                                            *(float *)(PtexHalf::h2fTable + (ulong)*puVar16 * 4)) *
                                            0.25);
                *(uint16_t *)dst = uVar6;
                dst = (void *)((long)dst + 2);
                src = (void *)((long)src + 2);
                puVar16 = puVar16 + 1;
                lVar11 = lVar11 + -2;
              } while (lVar11 != 0);
            }
            src = (void *)((long)src + lVar13 * 2);
            puVar16 = puVar16 + -(nchan + iVar14 * 2);
          } while ((ushort *)src != puVar3);
        }
        src = (void *)((long)src + (long)(iVar14 * 2 - iVar12) * 2);
        puVar16 = puVar16 + (iVar10 + nchan * -2);
        dst = (void *)((long)dst + (long)(dstride / 2 - iVar12 / 2) * 2);
      } while ((ushort *)src != puVar2);
    }
    break;
  case dt_float:
    iVar14 = sstride + 3;
    if (-1 < sstride) {
      iVar14 = sstride;
    }
    iVar14 = iVar14 >> 2;
    iVar10 = iVar14 * w;
    if (iVar10 != 0) {
      iVar7 = nchan * w;
      lVar13 = (long)nchan;
      pfVar4 = (float *)((long)src + (long)iVar10 * 4);
      iVar12 = dstride + 3;
      if (-1 < dstride) {
        iVar12 = dstride;
      }
      pfVar9 = (float *)((long)src + lVar13 * -4 + (long)iVar7 * 4 + (long)((w + -1) * iVar14) * 4);
      do {
        if (iVar7 != 0) {
          pfVar5 = (float *)((long)src + (long)iVar7 * 4);
          do {
            lVar11 = lVar13 * 4;
            if (nchan != 0) {
              do {
                *(float *)dst =
                     (*src + *(float *)((long)src + lVar13 * 4) +
                      *(float *)((long)src + (long)iVar14 * 4) + *pfVar9) * 0.25;
                dst = (void *)((long)dst + 4);
                src = (void *)((long)src + 4);
                pfVar9 = pfVar9 + 1;
                lVar11 = lVar11 + -4;
              } while (lVar11 != 0);
            }
            src = (void *)((long)src + lVar13 * 4);
            pfVar9 = pfVar9 + -(nchan + iVar14 * 2);
          } while ((float *)src != pfVar5);
        }
        src = (void *)((long)src + (long)(iVar14 * 2 - iVar7) * 4);
        pfVar9 = pfVar9 + (iVar10 + nchan * -2);
        dst = (void *)((long)dst + (long)((iVar12 >> 2) - iVar7 / 2) * 4);
      } while ((float *)src != pfVar4);
    }
  }
  return;
}

Assistant:

void reduceTri(const void* src, int sstride, int w, int /*vw*/,
               void* dst, int dstride, DataType dt, int nchan)
{
    switch (dt) {
    case dt_uint8:     reduceTri(static_cast<const uint8_t*>(src), sstride, w, 0,
                                 static_cast<uint8_t*>(dst), dstride, nchan); break;
    case dt_half:      reduceTri(static_cast<const PtexHalf*>(src), sstride, w, 0,
                                 static_cast<PtexHalf*>(dst), dstride, nchan); break;
    case dt_uint16:    reduceTri(static_cast<const uint16_t*>(src), sstride, w, 0,
                                 static_cast<uint16_t*>(dst), dstride, nchan); break;
    case dt_float:     reduceTri(static_cast<const float*>(src), sstride, w, 0,
                                 static_cast<float*>(dst), dstride, nchan); break;
    }
}